

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_inline_table
          (serializer<toml::type_config> *this,table_type *t,table_format_info *param_3)

{
  bool bVar1;
  undefined8 in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  table_type *__range3;
  string_type *retval;
  key_type *in_stack_000001c0;
  serializer<toml::type_config> *in_stack_000001c8;
  value_type *in_stack_000006c0;
  serializer<toml::type_config> *in_stack_000006c8;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_48;
  undefined8 local_40;
  undefined1 local_21;
  undefined8 local_18;
  
  local_21 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,in_stack_ffffffffffffff0f);
  local_40 = local_18;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  while (bVar1 = std::__detail::operator==(&local_48,&local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
    ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                 *)0x7623b6);
    *(undefined1 *)(in_RSI + 0x18) = 1;
    format_key(in_stack_000001c8,in_stack_000001c0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(in_RDI);
    string_conv<std::__cxx11::string,4ul>
              ((char (*) [4])CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(in_RDI);
    operator()[abi_cxx11_(in_stack_000006c8,in_stack_000006c0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(in_RDI);
    string_conv<std::__cxx11::string,3ul>
              ((char (*) [3])CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(in_RDI);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                  *)in_RDI);
  }
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                   *)0x762557);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_RDI);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_RDI);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,in_stack_ffffffffffffff0f);
  *(undefined1 *)(in_RSI + 0x18) = 0;
  return (string_type *)in_RDI;
}

Assistant:

string_type format_inline_table(const table_type& t, const table_format_info&) // {{{
    {
        // comments are ignored because we cannot write without newline
        string_type retval;
        retval += char_type('{');
        for(const auto& kv : t)
        {
            this->force_inline_ = true;
            retval += this->format_key(kv.first);
            retval += string_conv<string_type>(" = ");
            retval += (*this)(kv.second);
            retval += string_conv<string_type>(", ");
        }
        if( ! t.empty())
        {
            retval.pop_back(); // ' '
            retval.pop_back(); // ','
        }
        retval += char_type('}');
        this->force_inline_ = false;
        return retval;
    }